

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

boolean flush_bits_s(working_state *state)

{
  boolean bVar1;
  
  bVar1 = emit_bits_s(state,0x7f,7);
  if (bVar1 != 0) {
    (state->cur).put_buffer = 0;
    (state->cur).put_bits = 0;
  }
  return (uint)(bVar1 != 0);
}

Assistant:

LOCAL(boolean)
flush_bits_s (working_state * state)
{
  if (! emit_bits_s(state, 0x7F, 7)) /* fill any partial byte with ones */
    return FALSE;
  state->cur.put_buffer = 0;	     /* and reset bit-buffer to empty */
  state->cur.put_bits = 0;
  return TRUE;
}